

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O3

char * __thiscall CInput::GetClipboardText(CInput *this)

{
  char *pcVar1;
  
  if (this->m_pClipboardText != (char *)0x0) {
    SDL_free();
  }
  pcVar1 = (char *)SDL_GetClipboardText();
  this->m_pClipboardText = pcVar1;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    str_sanitize_cc(pcVar1);
    pcVar1 = this->m_pClipboardText;
  }
  return pcVar1;
}

Assistant:

const char *CInput::GetClipboardText()
{
	if(m_pClipboardText)
		SDL_free(m_pClipboardText);
	m_pClipboardText = SDL_GetClipboardText();
	if(m_pClipboardText)
		str_sanitize_cc(m_pClipboardText);
	return m_pClipboardText;
}